

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ObjCheckTfi_rec(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode,Vec_Ptr_t *vVisited)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Ptr_t *vVisited_local;
  Gia_Obj_t *pNode_local;
  Gia_Obj_t *pOld_local;
  Gia_Man_t *p_local;
  
  if (pNode == (Gia_Obj_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Gia_ObjIsCi(pNode);
    if (iVar1 == 0) {
      if (pNode == pOld) {
        p_local._4_4_ = 1;
      }
      else if ((*(ulong *)pNode >> 0x1e & 1) == 0) {
        *(ulong *)pNode = *(ulong *)pNode & 0xffffffffbfffffff | 0x40000000;
        Vec_PtrPush(vVisited,pNode);
        pGVar2 = Gia_ObjFanin0(pNode);
        iVar1 = Gia_ObjCheckTfi_rec(p,pOld,pGVar2,vVisited);
        if (iVar1 == 0) {
          pGVar2 = Gia_ObjFanin1(pNode);
          iVar1 = Gia_ObjCheckTfi_rec(p,pOld,pGVar2,vVisited);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjId(p,pNode);
            pGVar2 = Gia_ObjNextObj(p,iVar1);
            p_local._4_4_ = Gia_ObjCheckTfi_rec(p,pOld,pGVar2,vVisited);
          }
          else {
            p_local._4_4_ = 1;
          }
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ObjCheckTfi_rec( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode, Vec_Ptr_t * vVisited )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
//    if ( pNode->Id < pOld->Id ) // cannot use because of choices of pNode
//        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( pNode->fMark0 )
        return 0;
    pNode->fMark0 = 1;
    Vec_PtrPush( vVisited, pNode );
    // check the children
    if ( Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjFanin0(pNode), vVisited ) )
        return 1;
    if ( Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjFanin1(pNode), vVisited ) )
        return 1;
    // check equivalent nodes
    return Gia_ObjCheckTfi_rec( p, pOld, Gia_ObjNextObj(p, Gia_ObjId(p, pNode)), vVisited );
}